

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O2

bool libwebm::vttdemux::ParseHeader(IMkvReader *reader,mkvpos_t *pos)

{
  int iVar1;
  longlong lVar2;
  bool bVar3;
  char *__s;
  EBMLHeader h;
  EBMLHeader local_50;
  
  mkvparser::EBMLHeader::EBMLHeader(&local_50);
  lVar2 = mkvparser::EBMLHeader::Parse(&local_50,reader,pos);
  if (lVar2 == 0) {
    __s = "bad doctype";
    if (local_50.m_docType != (char *)0x0) {
      iVar1 = strcmp(local_50.m_docType,"webm");
      if (iVar1 == 0) {
        bVar3 = true;
        goto LAB_0010e58f;
      }
    }
  }
  else {
    __s = "error parsing EBML header";
  }
  puts(__s);
  bVar3 = false;
LAB_0010e58f:
  mkvparser::EBMLHeader::~EBMLHeader(&local_50);
  return bVar3;
}

Assistant:

bool vttdemux::ParseHeader(mkvparser::IMkvReader* reader, mkvpos_t* pos) {
  mkvparser::EBMLHeader h;
  const mkvpos_t status = h.Parse(reader, *pos);

  if (status) {
    printf("error parsing EBML header\n");
    return false;
  }

  if (h.m_docType == NULL || strcmp(h.m_docType, "webm") != 0) {
    printf("bad doctype\n");
    return false;
  }

  return true;  // success
}